

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

Value __thiscall xmrig::String::toJSON(String *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  size_t sVar1;
  long in_RDX;
  long extraout_RDX;
  Value VVar2;
  Number local_28;
  SizeType local_20;
  
  local_28 = (doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ).data_.n;
  if ((char *)local_28.i64 == (char *)0x0) {
    this->m_data = (char *)0x0;
    this->m_size = 0;
  }
  else {
    allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
    this->m_data = (char *)0x0;
    this->m_size = 0;
    sVar1 = strlen((char *)local_28);
    local_20 = (SizeType)sVar1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetStringRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(StringRefType *)&local_28.i,allocator);
    in_RDX = extraout_RDX;
  }
  VVar2.data_.s.str = (Ch *)in_RDX;
  VVar2.data_.n = (Number)this;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::String::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;

    return isNull() ? Value(kNullType) : Value(m_data, doc.GetAllocator());
}